

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O2

void nn_sock_report_error(nn_sock *self,nn_ep *ep,int errnum)

{
  FILE *__stream;
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  
  iVar1 = nn_global_print_errors();
  __stream = _stderr;
  if (errnum == 0 || iVar1 == 0) {
    return;
  }
  if (ep == (nn_ep *)0x0) {
    pcVar2 = nn_strerror(errnum);
    fprintf(__stream,"nanomsg: socket.%s: Error: %s\n",self->socket_name,pcVar2);
    return;
  }
  pcVar2 = nn_ep_getaddr(ep);
  pcVar3 = nn_strerror(errnum);
  fprintf(__stream,"nanomsg: socket.%s[%s]: Error: %s\n",self->socket_name,pcVar2,pcVar3);
  return;
}

Assistant:

void nn_sock_report_error (struct nn_sock *self, struct nn_ep *ep, int errnum)
{
    if (!nn_global_print_errors())
        return;

    if (errnum == 0)
        return;

    if (ep) {
        fprintf(stderr, "nanomsg: socket.%s[%s]: Error: %s\n",
            self->socket_name, nn_ep_getaddr(ep), nn_strerror(errnum));
    } else {
        fprintf(stderr, "nanomsg: socket.%s: Error: %s\n",
            self->socket_name, nn_strerror(errnum));
    }
}